

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsCharLiteralTo<unsigned_char,unsigned_char>(uchar c,ostream *os)

{
  bool bVar1;
  fmtflags __fmtfl;
  ostream *this;
  void *pvVar2;
  ostream *in_RSI;
  byte in_DIL;
  fmtflags flags;
  
  switch(in_DIL) {
  case 0:
    std::operator<<(in_RSI,"\\0");
    break;
  default:
    bVar1 = IsPrintableAscii((uint)in_DIL);
    if (!bVar1) {
      __fmtfl = std::ios_base::flags((ios_base *)(in_RSI + *(long *)(*(long *)in_RSI + -0x18)));
      this = std::operator<<(in_RSI,"\\x");
      pvVar2 = (void *)std::ostream::operator<<(this,std::hex);
      pvVar2 = (void *)std::ostream::operator<<(pvVar2,std::uppercase);
      std::ostream::operator<<(pvVar2,(uint)in_DIL);
      std::ios_base::flags((ios_base *)(in_RSI + *(long *)(*(long *)in_RSI + -0x18)),__fmtfl);
      return kHexEscape;
    }
    std::operator<<(in_RSI,in_DIL);
    return kAsIs;
  case 7:
    std::operator<<(in_RSI,"\\a");
    break;
  case 8:
    std::operator<<(in_RSI,"\\b");
    break;
  case 9:
    std::operator<<(in_RSI,"\\t");
    break;
  case 10:
    std::operator<<(in_RSI,"\\n");
    break;
  case 0xb:
    std::operator<<(in_RSI,"\\v");
    break;
  case 0xc:
    std::operator<<(in_RSI,"\\f");
    break;
  case 0xd:
    std::operator<<(in_RSI,"\\r");
    break;
  case 0x27:
    std::operator<<(in_RSI,"\\\'");
    break;
  case 0x5c:
    std::operator<<(in_RSI,"\\\\");
  }
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        ostream::fmtflags flags = os->flags();
        *os << "\\x" << std::hex << std::uppercase
            << static_cast<int>(static_cast<UnsignedChar>(c));
        os->flags(flags);
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}